

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast2json.cc
# Opt level: O2

int ProgramMain(int argc,char **argv)

{
  char *pcVar1;
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> script_00;
  pointer pFVar2;
  Result RVar3;
  wabt *pwVar4;
  size_t sVar5;
  Callback *callback;
  char *extraout_RDX;
  char *extraout_RDX_00;
  int iVar6;
  pointer pFVar7;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string_view filename_02;
  string_view filename_03;
  string_view filename_04;
  string_view sVar8;
  string_view source_filename;
  string_view module_filename_noext;
  Errors *in_stack_fffffffffffffe80;
  unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  line_finder;
  undefined8 data;
  code *pcVar9;
  code *pcVar10;
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> script;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
  module_streams;
  Errors errors;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  OptionParser parser;
  string_view local_58;
  WastParseOptions parse_wast_options;
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            (&parser,"wast2json",
             "  read a file in the wasm spec test format, check it for errors, and\n  convert it to a JSON file and associated wasm binary files.\n\nexamples:\n  # parse spec-test.wast, and write files to spec-test.json. Modules are\n  # written to spec-test.0.wasm, spec-test.1.wasm, etc.\n  $ wast2json spec-test.wast -o spec-test.json\n"
            );
  _line_finder = (_Any_data)ZEXT816(0);
  pcVar9 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:64:72)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'v',"verbose","Use multiple times for more info",(NullCallback *)&line_finder);
  if (pcVar9 != (_Manager_type)0x0) {
    (*pcVar9)(&line_finder,&line_finder,3);
  }
  _line_finder = (_Any_data)ZEXT816(0);
  pcVar9 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:69:20)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"debug-parser","Turn on debugging the parser of wast files",
             (NullCallback *)&line_finder);
  if (pcVar9 != (_Manager_type)0x0) {
    (*pcVar9)(&line_finder,&line_finder,3);
  }
  wabt::Features::AddOptions(&s_features,&parser);
  _line_finder = (_Any_data)ZEXT816(0);
  pcVar9 = std::
           _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:72:20)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'o',"output","FILE","output JSON file",(Callback *)&line_finder);
  if (pcVar9 != (_Manager_type)0x0) {
    (*pcVar9)(&line_finder,&line_finder,3);
  }
  _line_finder = (_Any_data)ZEXT816(0);
  pcVar9 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:76:7)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'r',"relocatable",
             "Create a relocatable wasm binary (suitable for linking with e.g. lld)",
             (NullCallback *)&line_finder);
  if (pcVar9 != (_Manager_type)0x0) {
    (*pcVar9)(&line_finder,&line_finder,3);
  }
  _line_finder = (_Any_data)ZEXT816(0);
  pcVar9 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:80:7)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"no-canonicalize-leb128s",
             "Write all LEB128 sizes as 5-bytes instead of their minimal size",
             (NullCallback *)&line_finder);
  if (pcVar9 != (_Manager_type)0x0) {
    (*pcVar9)(&line_finder,&line_finder,3);
  }
  _line_finder = (_Any_data)ZEXT816(0);
  pcVar9 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:83:20)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"debug-names","Write debug names to the generated binary file",
             (NullCallback *)&line_finder);
  if (pcVar9 != (_Manager_type)0x0) {
    (*pcVar9)(&line_finder,&line_finder,3);
  }
  _line_finder = (_Any_data)ZEXT816(0);
  pcVar10 = std::
            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:85:20)>
            ::_M_invoke;
  pcVar9 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:85:20)>
           ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"no-check","Don\'t check for invalid modules",(NullCallback *)&line_finder);
  if (pcVar9 != (_Manager_type)0x0) {
    (*pcVar9)(&line_finder,&line_finder,3);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&line_finder,"filename",(allocator<char> *)&errors);
  callback = (Callback *)&file_data;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wast2json.cc:87:22)>
                ::_M_manager;
  wabt::OptionParser::AddArgument(&parser,(string *)&line_finder,One,callback);
  if (file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(&file_data,&file_data,3);
  }
  std::__cxx11::string::_M_dispose();
  wabt::OptionParser::Parse(&parser,argc,argv);
  wabt::OptionParser::~OptionParser(&parser);
  pcVar1 = s_infile;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pwVar4 = (wabt *)strlen(s_infile);
  filename._M_str = (char *)&file_data;
  filename._M_len = (size_t)pcVar1;
  RVar3 = wabt::ReadFile(pwVar4,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  strlen(s_infile);
  sVar8._M_str = (char *)pcVar10;
  sVar8._M_len = (size_t)pcVar9;
  wabt::WastLexer::CreateBufferLexer
            (sVar8,(void *)data,
             (size_t)line_finder._M_t.
                     super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
                     .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl,
             in_stack_fffffffffffffe80);
  if (RVar3.enum_ == Error) {
    fprintf(_stderr,"unable to read file: %s\n",s_infile);
    exit(1);
  }
  script._M_t.super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
  super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::Script,_std::default_delete<wabt::Script>,_true,_true>)
       (__uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>)0x0;
  parse_wast_options.features.extended_const_enabled_ = s_features.extended_const_enabled_;
  parse_wast_options.features.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
  parse_wast_options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
  parse_wast_options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
  parse_wast_options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
  parse_wast_options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
  parse_wast_options.features.simd_enabled_ = s_features.simd_enabled_;
  parse_wast_options.features.threads_enabled_ = s_features.threads_enabled_;
  parse_wast_options.features.function_references_enabled_ = s_features.function_references_enabled_
  ;
  parse_wast_options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
  parse_wast_options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
  parse_wast_options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
  parse_wast_options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
  parse_wast_options.features.annotations_enabled_ = s_features.annotations_enabled_;
  parse_wast_options.features.code_metadata_enabled_ = s_features.code_metadata_enabled_;
  parse_wast_options.features.gc_enabled_ = s_features.gc_enabled_;
  parse_wast_options.features.memory64_enabled_ = s_features.memory64_enabled_;
  parse_wast_options.features.multi_memory_enabled_ = s_features.multi_memory_enabled_;
  parse_wast_options.debug_parsing = false;
  RVar3 = wabt::ParseWastScript
                    ((WastLexer *)
                     lexer._M_t.
                     super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>
                     .super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl,&script,&errors,
                     &parse_wast_options);
  iVar6 = 1;
  if (RVar3.enum_ == Ok) {
    if (s_validate == '\0') {
      parser.program_name_.field_2._0_1_ = s_features.extended_const_enabled_;
      parser.program_name_.field_2._1_1_ = s_features.relaxed_simd_enabled_;
      parser.program_name_._M_dataplus._M_p = (pointer)s_features._0_8_;
      parser.program_name_._M_string_length._0_1_ = s_features.tail_call_enabled_;
      parser.program_name_._M_string_length._1_1_ = s_features.bulk_memory_enabled_;
      parser.program_name_._M_string_length._2_1_ = s_features.reference_types_enabled_;
      parser.program_name_._M_string_length._3_1_ = s_features.annotations_enabled_;
      parser.program_name_._M_string_length._4_1_ = s_features.code_metadata_enabled_;
      parser.program_name_._M_string_length._5_1_ = s_features.gc_enabled_;
      parser.program_name_._M_string_length._6_1_ = s_features.memory64_enabled_;
      parser.program_name_._M_string_length._7_1_ = s_features.multi_memory_enabled_;
      RVar3 = wabt::ValidateScript
                        ((Script *)
                         script._M_t.
                         super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
                         super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl,&errors,
                         (ValidateOptions *)&parser);
      if (RVar3.enum_ != Ok) goto LAB_00115bb8;
    }
    pcVar1 = s_infile;
    if (s_outfile_abi_cxx11_._M_string_length == 0) {
      pwVar4 = (wabt *)strlen(s_infile);
      filename_00._M_str = extraout_RDX;
      filename_00._M_len = (size_t)pcVar1;
      sVar8 = wabt::GetBasename(pwVar4,filename_00);
      filename_01._M_str = sVar8._M_str;
      filename_01._M_len = (size_t)filename_01._M_str;
      _line_finder = (_Any_data)wabt::StripExtension((wabt *)sVar8._M_len,filename_01);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&parser,(basic_string_view<char,_std::char_traits<char>_> *)&line_finder,
                 (allocator<char> *)&module_streams);
      std::__cxx11::string::append((char *)&parser);
      std::__cxx11::string::operator=((string *)&s_outfile_abi_cxx11_,(string *)&parser);
      std::__cxx11::string::_M_dispose();
    }
    module_streams.
    super__Vector_base<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    module_streams.
    super__Vector_base<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    module_streams.
    super__Vector_base<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    wabt::MemoryStream::MemoryStream((MemoryStream *)&parser,(Stream *)0x0);
    filename_02._M_str = extraout_RDX_00;
    filename_02._M_len = (size_t)s_outfile_abi_cxx11_._M_dataplus._M_p;
    local_58 = wabt::StripExtension((wabt *)s_outfile_abi_cxx11_._M_string_length,filename_02);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&line_finder,&local_58,(allocator<char> *)&stack0xfffffffffffffe87);
    script_00 = script;
    pcVar1 = s_infile;
    s_write_binary_options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    s_write_binary_options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    s_write_binary_options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_
    ;
    s_write_binary_options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    s_write_binary_options.features.simd_enabled_ = s_features.simd_enabled_;
    s_write_binary_options.features.threads_enabled_ = s_features.threads_enabled_;
    s_write_binary_options.features.function_references_enabled_ =
         s_features.function_references_enabled_;
    s_write_binary_options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    s_write_binary_options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    s_write_binary_options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    s_write_binary_options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    s_write_binary_options.features.annotations_enabled_ = s_features.annotations_enabled_;
    s_write_binary_options.features.code_metadata_enabled_ = s_features.code_metadata_enabled_;
    s_write_binary_options.features.gc_enabled_ = s_features.gc_enabled_;
    s_write_binary_options.features.memory64_enabled_ = s_features.memory64_enabled_;
    s_write_binary_options.features.multi_memory_enabled_ = s_features.multi_memory_enabled_;
    s_write_binary_options.features.extended_const_enabled_ = s_features.extended_const_enabled_;
    s_write_binary_options.features.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
    sVar5 = strlen(s_infile);
    source_filename._M_str = pcVar1;
    source_filename._M_len = sVar5;
    module_filename_noext._M_str =
         (char *)line_finder._M_t.
                 super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
                 .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl;
    module_filename_noext._M_len = data;
    RVar3 = wabt::WriteBinarySpecScript
                      ((Stream *)&parser,
                       (Script *)
                       script_00._M_t.
                       super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t.
                       super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
                       super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl,source_filename,
                       module_filename_noext,&s_write_binary_options,&module_streams,
                       (Stream *)
                       s_log_stream._M_t.
                       super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                       .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl);
    iVar6 = 1;
    if (RVar3.enum_ == Ok) {
      filename_03._M_str = s_outfile_abi_cxx11_._M_dataplus._M_p;
      filename_03._M_len = s_outfile_abi_cxx11_._M_string_length;
      RVar3 = wabt::OutputBuffer::WriteToFile
                        ((OutputBuffer *)parser.description_._M_dataplus._M_p,filename_03);
      pFVar2 = module_streams.
               super__Vector_base<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pFVar7 = module_streams.
               super__Vector_base<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
               ._M_impl.super__Vector_impl_data._M_start;
      while (RVar3.enum_ == Ok) {
        if (pFVar7 == pFVar2) {
          iVar6 = 0;
          break;
        }
        filename_04._M_str = (pFVar7->filename)._M_dataplus._M_p;
        filename_04._M_len = (pFVar7->filename)._M_string_length;
        RVar3 = wabt::MemoryStream::WriteToFile
                          ((pFVar7->stream)._M_t.
                           super___uniq_ptr_impl<wabt::MemoryStream,_std::default_delete<wabt::MemoryStream>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wabt::MemoryStream_*,_std::default_delete<wabt::MemoryStream>_>
                           .super__Head_base<0UL,_wabt::MemoryStream_*,_false>._M_head_impl,
                           filename_04);
        pFVar7 = pFVar7 + 1;
      }
    }
    std::__cxx11::string::_M_dispose();
    wabt::MemoryStream::~MemoryStream((MemoryStream *)&parser);
    std::vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>::
    ~vector(&module_streams);
  }
LAB_00115bb8:
  wabt::WastLexer::MakeLineFinder((WastLexer *)&line_finder);
  parser.program_name_._M_dataplus._M_p = (pointer)&parser.program_name_.field_2;
  parser.program_name_._M_string_length = 0;
  parser.program_name_.field_2._M_allocated_capacity._0_2_ =
       parser.program_name_.field_2._M_allocated_capacity._0_2_ & 0xff00;
  wabt::FormatErrorsToFile
            (&errors,Text,
             (LexerSourceLineFinder *)
             line_finder._M_t.
             super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
             .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl,
             (FILE *)_stderr,&parser.program_name_,Never,0x50);
  std::__cxx11::string::_M_dispose();
  std::unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>::
  ~unique_ptr(&line_finder);
  std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::~unique_ptr(&script);
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::~unique_ptr(&lexer);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return iVar6;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();

  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  Result result = ReadFile(s_infile, &file_data);
  Errors errors;
  std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
      s_infile, file_data.data(), file_data.size(), &errors);
  if (Failed(result)) {
    WABT_FATAL("unable to read file: %s\n", s_infile);
  }

  std::unique_ptr<Script> script;
  WastParseOptions parse_wast_options(s_features);
  result = ParseWastScript(lexer.get(), &script, &errors, &parse_wast_options);

  if (Succeeded(result) && s_validate) {
    ValidateOptions options(s_features);
    result = ValidateScript(script.get(), &errors, options);
  }

  if (Succeeded(result)) {
    if (s_outfile.empty()) {
      s_outfile = DefaultOuputName(s_infile);
    }

    std::vector<FilenameMemoryStreamPair> module_streams;
    MemoryStream json_stream;

    std::string output_basename(StripExtension(s_outfile));
    s_write_binary_options.features = s_features;
    result = WriteBinarySpecScript(&json_stream, script.get(), s_infile,
                                   output_basename, s_write_binary_options,
                                   &module_streams, s_log_stream.get());

    if (Succeeded(result)) {
      result = json_stream.WriteToFile(s_outfile);
    }

    if (Succeeded(result)) {
      for (const auto& pair : module_streams) {
        result = pair.stream->WriteToFile(pair.filename);
        if (!Succeeded(result)) {
          break;
        }
      }
    }
  }

  auto line_finder = lexer->MakeLineFinder();
  FormatErrorsToFile(errors, Location::Type::Text, line_finder.get());

  return result != Result::Ok;
}